

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_opengl.h
# Opt level: O0

bool djgp_push_file(djg_program *program,char *file)

{
  int iVar1;
  size_t sVar2;
  int local_38;
  undefined1 local_31;
  int n;
  char letter;
  char *src;
  FILE *pf;
  char *file_local;
  djg_program *program_local;
  
  local_38 = 0;
  pf = (FILE *)file;
  file_local = (char *)program;
  if (program == (djg_program *)0x0) {
    __assert_fail("program",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/dj_opengl/dj_opengl.h"
                  ,0x1ba,"bool djgp_push_file(djg_program *, const char *)");
  }
  src = (char *)fopen(file,"r");
  iVar1 = local_38;
  if ((FILE *)src == (FILE *)0x0) {
    fprintf(_stdout,"djg_error: Function fopen() failed\n");
    fflush(_stdout);
    program_local._7_1_ = false;
  }
  else {
    do {
      local_38 = iVar1;
      sVar2 = fread(&local_31,1,1,(FILE *)src);
      iVar1 = local_38 + 1;
    } while (sVar2 != 0);
    rewind((FILE *)src);
    _n = (char *)malloc((long)(local_38 + 2));
    fread(_n,1,(long)(local_38 + 1),(FILE *)src);
    fclose((FILE *)src);
    _n[local_38] = '\n';
    _n[local_38 + 1] = '\0';
    djgp_push_string((djg_program *)file_local,"#line 1\n");
    program_local._7_1_ = djgp__push_src((djg_program *)file_local,_n);
  }
  return program_local._7_1_;
}

Assistant:

DJGDEF bool djgp_push_file(djg_program *program, const char *file)
{
    FILE *pf;
    char *src, letter;
    int n = 0;

    DJG_ASSERT(program);
    pf = fopen(file, "r");
    if (!pf) {
        DJG_LOG("djg_error: Function fopen() failed\n");
        return false;
    }

    // get file length
#if 0 // nonportable (does not work with vs2010)
    fseek(pf, 0, SEEK_END);
    n = (int)ftell(pf) + /* '\0' */1;
#else
    do {++n;} while (fread(&letter, 1, 1, pf));
    ++n; // add an extra char for an endline
#endif
    rewind(pf);

    // read and push to source
    src = (char *)DJG_MALLOC(sizeof(char) * n);
    fread(src, 1, n-1, pf);
    fclose(pf);
    src[n-2] = '\n'; // add endline
    src[n-1] = '\0'; // add EOF

    // add a line parameter (easier for debugging)
    djgp_push_string(program, "#line 1\n");

    return djgp__push_src(program, src);
}